

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

bool DoDehPatch(void)

{
  Variant *pVVar1;
  BYTE *pBVar2;
  char *__s1;
  DEHSprName *pDVar3;
  StateMapper *pSVar4;
  BitName *pBVar5;
  StyleName *pSVar6;
  CodePointerAlias *pCVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  FStringTable *this;
  long lVar13;
  DObject *p;
  PFunction *pPVar14;
  size_t sVar15;
  PClassActor *pPVar16;
  PClass *pPVar17;
  FState *pFVar18;
  PClass *pPVar19;
  PClassAmmo *pPVar20;
  long lVar21;
  ulong uVar22;
  PClassActor *pPVar23;
  char cVar24;
  int *piVar25;
  char *pcVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  anon_struct_16_2_3f885e32 *paVar30;
  FString name;
  FScanner sc;
  FString local_158;
  undefined4 uStack_150;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined2 uStack_14a;
  undefined1 uStack_148;
  undefined2 uStack_147;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 uStack_140;
  uint local_13c;
  FName local_138;
  FName local_134;
  FScanner local_130;
  
  if (!batchrun) {
    Printf("Adding dehacked patch %s\n",PatchName);
  }
  pcVar26 = PatchFile;
  pversion = -1;
  dversion = -1;
  iVar9 = strncmp(PatchFile,"Patch File for DeHackEd v",0x19);
  if (iVar9 == 0) {
    if ((pcVar26[0x19] < '2') && (pcVar26[0x1b] != '3')) {
      Printf(200,"\"%s\" is an old and unsupported DeHackEd patch\n",PatchName);
      goto LAB_00482d6f;
    }
    lVar13 = (long)PatchSize;
    if (0 < lVar13) {
      lVar21 = 0;
      do {
        if (pcVar26[lVar21] == '\0') {
          pcVar26[lVar21] = ' ';
        }
        lVar21 = lVar21 + 1;
      } while (lVar13 != lVar21);
    }
    PatchPt = strchr(pcVar26,10);
    iVar9 = GetLine();
    pcVar26 = Line1;
    while (Line1 = pcVar26, iVar9 == 1) {
      iVar9 = strcasecmp(pcVar26,"Doom version");
      piVar25 = &dversion;
      if (iVar9 == 0) {
LAB_00482e3c:
        iVar9 = atoi(Line2);
        *piVar25 = iVar9;
      }
      else {
        iVar9 = strcasecmp(pcVar26,"Patch format");
        piVar25 = &pversion;
        if (iVar9 == 0) goto LAB_00482e3c;
      }
      iVar9 = GetLine();
      pcVar26 = Line1;
    }
    if (((iVar9 == 0) || (dversion == -1)) || (pversion == -1)) {
      if (PatchName != (char *)0x0) {
        operator_delete__(PatchName);
      }
      if (PatchFile != (char *)0x0) {
        operator_delete__(PatchFile);
      }
      Printf(200,"\"%s\" is not a DeHackEd patch file\n",PatchFile);
      return false;
    }
  }
  else {
    DPrintf(2,"Patch does not have DeHackEd signature. Assuming .bex\n");
    dversion = 0x13;
    pversion = 6;
    PatchPt = PatchFile;
    do {
      iVar9 = GetLine();
    } while (iVar9 == 1);
  }
  if (pversion - 7U < 0xfffffffe) {
    Printf("DeHackEd patch version is %d.\nUnexpected results may occur.\n");
  }
  uVar10 = dversion - 0x10;
  if ((uVar10 < 6) && ((0x3bU >> (uVar10 & 0x1f) & 1) != 0)) {
    dversion = *(int *)(&DAT_0072f234 + (ulong)uVar10 * 4);
  }
  else {
    Printf("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
    dversion = 3;
  }
  iVar11 = FWadCollection::CheckNumForName(&Wads,"DEHSUPP",0);
  if (iVar11 != -1) {
    iVar12 = FWadCollection::GetLumpFile(&Wads,iVar11);
    if (iVar12 < 1) {
      iVar12 = DehUseCount + 1;
      bVar8 = DehUseCount < 1;
      DehUseCount = iVar12;
      if (bVar8) {
        if (EnglishStrings == (FStringTable *)0x0) {
          this = (FStringTable *)operator_new(0x400);
          FStringTable::FStringTable(this);
          EnglishStrings = this;
          FStringTable::LoadStrings(this,true);
        }
        uVar10 = sprites.Count;
        if (UnchangedSpriteNames == (char *)0x0) {
          UnchangedSpriteNames = (char *)operator_new__((ulong)(sprites.Count * 4));
          NumUnchangedSprites = uVar10;
          if (0 < (int)uVar10) {
            lVar13 = 0;
            lVar21 = 0;
            do {
              *(undefined4 *)(UnchangedSpriteNames + lVar21 * 4) =
                   *(undefined4 *)((long)&(sprites.Array)->field_0 + lVar13);
              lVar21 = lVar21 + 1;
              lVar13 = lVar13 + 0xc;
            } while (lVar21 < NumUnchangedSprites);
          }
        }
        FScanner::FScanner(&local_130);
        FScanner::OpenLumpNum(&local_130,iVar11);
        FScanner::SetCMode(&local_130,true);
        while( true ) {
          bVar8 = FScanner::GetString(&local_130);
          if (!bVar8) break;
          bVar8 = FScanner::Compare(&local_130,"ActionList");
          if (bVar8) {
            FScanner::MustGetStringName(&local_130,"{");
            while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
              FScanner::MustGetString(&local_130);
              bVar8 = FScanner::Compare(&local_130,"NULL");
              if (bVar8) {
                TArray<PFunction_*,_PFunction_*>::Grow(&Actions,1);
                Actions.Array[Actions.Count] = (PFunction *)0x0;
                Actions.Count = Actions.Count + 1;
              }
              else {
                FString::FString(&local_158,"A_");
                FString::operator+=(&local_158,local_130.String);
                pPVar19 = AInventory::RegistrationInfo.MyClass;
                local_134.Index =
                     FName::NameManager::FindName
                               (&FName::NameData,
                                (char *)CONCAT44(local_158.Chars._4_4_,(int)local_158.Chars),
                                (ulong)*(uint *)((char *)CONCAT44(local_158.Chars._4_4_,
                                                                  (int)local_158.Chars) + -0xc),
                                false);
                p = &PSymbolTable::FindSymbol
                               (&(pPVar19->super_PStruct).super_PNamedType.super_PCompoundType.
                                 super_PType.Symbols,&local_134,true)->super_DObject;
                pPVar14 = dyn_cast<PFunction>(p);
                if (pPVar14 == (PFunction *)0x0) {
                  FScanner::ScriptError(&local_130,"Unknown code pointer \'%s\'",local_130.String);
                }
                else if (((~pPVar14->Flags & 6) != 0) ||
                        ((pVVar1 = (pPVar14->Variants).Array, 3 < (pVVar1->ArgFlags).Count &&
                         (((pVVar1->ArgFlags).Array[3] & 1) == 0)))) {
                  FScanner::ScriptMessage
                            (&local_130,"Incompatible code pointer \'%s\'",local_130.String);
                }
                TArray<PFunction_*,_PFunction_*>::Grow(&Actions,1);
                Actions.Array[Actions.Count] = pPVar14;
                Actions.Count = Actions.Count + 1;
                FString::~FString(&local_158);
              }
              bVar8 = FScanner::CheckString(&local_130,"}");
              if (bVar8) break;
              FScanner::MustGetStringName(&local_130,",");
            }
          }
          else {
            bVar8 = FScanner::Compare(&local_130,"OrgHeights");
            if (bVar8) {
              FScanner::MustGetStringName(&local_130,"{");
              while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                FScanner::MustGetNumber(&local_130);
                TArray<int,_int>::Grow(&OrgHeights,1);
                OrgHeights.Array[OrgHeights.Count] = local_130.Number;
                OrgHeights.Count = OrgHeights.Count + 1;
                bVar8 = FScanner::CheckString(&local_130,"}");
                if (bVar8) break;
                FScanner::MustGetStringName(&local_130,",");
              }
            }
            else {
              bVar8 = FScanner::Compare(&local_130,"CodePConv");
              if (bVar8) {
                FScanner::MustGetStringName(&local_130,"{");
                while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                  FScanner::MustGetNumber(&local_130);
                  TArray<int,_int>::Grow(&CodePConv,1);
                  CodePConv.Array[CodePConv.Count] = local_130.Number;
                  CodePConv.Count = CodePConv.Count + 1;
                  bVar8 = FScanner::CheckString(&local_130,"}");
                  if (bVar8) break;
                  FScanner::MustGetStringName(&local_130,",");
                }
              }
              else {
                bVar8 = FScanner::Compare(&local_130,"OrgSprNames");
                if (bVar8) {
                  FScanner::MustGetStringName(&local_130,"{");
                  while( true ) {
                    bVar8 = FScanner::CheckString(&local_130,"}");
                    if (bVar8) break;
                    FScanner::MustGetString(&local_130);
                    pcVar26 = local_130.String;
                    sVar15 = strlen(local_130.String);
                    if (sVar15 == 4) {
                      cVar29 = *pcVar26;
                      cVar24 = pcVar26[1];
                      cVar28 = pcVar26[2];
                      cVar27 = pcVar26[3];
                    }
                    else {
                      cVar27 = '\0';
                      FScanner::ScriptError
                                (&local_130,"Invalid sprite name \'%s\' (must be 4 characters)",
                                 pcVar26);
                      cVar28 = '\0';
                      cVar24 = '\0';
                      cVar29 = '\0';
                    }
                    TArray<DEHSprName,_DEHSprName>::Grow(&OrgSprNames,1);
                    pDVar3 = OrgSprNames.Array;
                    uVar22 = (ulong)OrgSprNames.Count;
                    OrgSprNames.Array[uVar22].c[0] = cVar29;
                    pDVar3[uVar22].c[1] = cVar24;
                    pDVar3[uVar22].c[2] = cVar28;
                    pDVar3[uVar22].c[3] = cVar27;
                    pDVar3[uVar22].c[4] = '\0';
                    OrgSprNames.Count = OrgSprNames.Count + 1;
                    bVar8 = FScanner::CheckString(&local_130,"}");
                    if ((bVar8) || (FScanner::MustGetStringName(&local_130,","), bVar8)) break;
                  }
                }
                else {
                  bVar8 = FScanner::Compare(&local_130,"StateMap");
                  if (bVar8) {
                    local_13c = StateMap.Count;
                    FScanner::MustGetStringName(&local_130,"{");
                    while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                      FScanner::MustGetString(&local_130);
                      local_158.Chars._0_4_ =
                           FName::NameManager::FindName(&FName::NameData,local_130.String,true);
                      pPVar16 = (PClassActor *)PClass::FindClass((FName *)&local_158);
                      pPVar19 = PClassActor::RegistrationInfo.MyClass;
                      pcVar26 = "Can\'t find type %s";
                      if (pPVar16 == (PClassActor *)0x0) {
LAB_00483431:
                        FScanner::ScriptError(&local_130,pcVar26,local_130.String);
                      }
                      else {
                        if ((pPVar16->super_PClass).super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_DObject.Class == (PClass *)0x0) {
                          pPVar17 = (PClass *)
                                    (**(pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                       super_PCompoundType.super_PType.super_DObject._vptr_DObject)
                                              (pPVar16);
                          (pPVar16->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType
                          .super_PType.super_DObject.Class = pPVar17;
                        }
                        pPVar17 = (pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                  super_PCompoundType.super_PType.super_DObject.Class;
                        bVar8 = pPVar17 != (PClass *)0x0;
                        if (pPVar17 != pPVar19 && bVar8) {
                          do {
                            pPVar17 = pPVar17->ParentClass;
                            bVar8 = pPVar17 != (PClass *)0x0;
                            if (pPVar17 == pPVar19) break;
                          } while (pPVar17 != (PClass *)0x0);
                        }
                        pcVar26 = "%s is not an actor";
                        if (!bVar8) goto LAB_00483431;
                      }
                      FScanner::MustGetStringName(&local_130,",");
                      FScanner::MustGetString(&local_130);
                      local_138.Index =
                           FName::NameManager::FindName(&FName::NameData,local_130.String,false);
                      pFVar18 = PClassActor::FindState(pPVar16,1,&local_138,false);
                      if (pFVar18 == (FState *)0x0) {
                        FScanner::ScriptError
                                  (&local_130,"Invalid state \'%s\' in \'%s\'",local_130.String,
                                   FName::NameData.NameArray
                                   [(pPVar16->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                    Index].Text);
                      }
                      FScanner::MustGetStringName(&local_130,",");
                      FScanner::MustGetNumber(&local_130);
                      if ((pFVar18 == (FState *)0x0) ||
                         (pPVar16->OwnedStates + pPVar16->NumOwnedStates <
                          pFVar18 + local_130.Number)) {
                        FScanner::ScriptError
                                  (&local_130,"Invalid state range in \'%s\'",
                                   FName::NameData.NameArray
                                   [(pPVar16->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                    Index].Text);
                      }
                      iVar11 = local_130.Number;
                      pBVar2 = (pPVar16->super_PClass).Defaults;
                      if (pBVar2 == (BYTE *)0x0) {
                        bVar8 = false;
                      }
                      else {
                        bVar8 = (bool)(pBVar2[0x18c] & 1);
                      }
                      if (local_13c == 0) {
                        TArray<StateMapper,_StateMapper>::Grow(&StateMap,1);
                        pSVar4 = StateMap.Array;
                        uVar22 = (ulong)StateMap.Count;
                        StateMap.Array[uVar22].State = pFVar18;
                        pSVar4[uVar22].StateSpan = iVar11;
                        pSVar4[uVar22].Owner = pPVar16;
                        pSVar4[uVar22].OwnerIsPickup = bVar8;
                        StateMap.Count = StateMap.Count + 1;
                      }
                      bVar8 = FScanner::CheckString(&local_130,"}");
                      if ((bVar8) || (FScanner::MustGetStringName(&local_130,","), bVar8)) break;
                    }
                  }
                  else {
                    bVar8 = FScanner::Compare(&local_130,"SoundMap");
                    if (bVar8) {
                      FScanner::MustGetStringName(&local_130,"{");
                      while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                        FScanner::MustGetString(&local_130);
                        iVar11 = S_FindSound(local_130.String);
                        TArray<FSoundID,_FSoundID>::Grow(&SoundMap,1);
                        SoundMap.Array[SoundMap.Count].ID = iVar11;
                        SoundMap.Count = SoundMap.Count + 1;
                        bVar8 = FScanner::CheckString(&local_130,"}");
                        if (bVar8) break;
                        FScanner::MustGetStringName(&local_130,",");
                      }
                    }
                    else {
                      bVar8 = FScanner::Compare(&local_130,"InfoNames");
                      if (bVar8) {
                        FScanner::MustGetStringName(&local_130,"{");
                        while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                          FScanner::MustGetString(&local_130);
                          pPVar16 = PClass::FindActor(local_130.String);
                          if (pPVar16 == (PClassActor *)0x0) {
                            FScanner::ScriptError
                                      (&local_130,"Unknown actor type \'%s\'",local_130.String);
                          }
                          TArray<PClassActor_*,_PClassActor_*>::Grow(&InfoNames,1);
                          InfoNames.Array[InfoNames.Count] = pPVar16;
                          InfoNames.Count = InfoNames.Count + 1;
                          bVar8 = FScanner::CheckString(&local_130,"}");
                          if ((bVar8) || (FScanner::MustGetStringName(&local_130,","), bVar8))
                          break;
                        }
                      }
                      else {
                        bVar8 = FScanner::Compare(&local_130,"ThingBits");
                        if (bVar8) {
                          FScanner::MustGetStringName(&local_130,"{");
                          while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                            FScanner::MustGetNumber(&local_130);
                            if (0x1f < (uint)local_130.Number) {
                              FScanner::ScriptError(&local_130,"Invalid bit value %d");
                            }
                            uStack_144 = (undefined1)local_130.Number;
                            FScanner::MustGetStringName(&local_130,",");
                            FScanner::MustGetNumber(&local_130);
                            if (2 < (uint)local_130.Number) {
                              FScanner::ScriptError(&local_130,"Invalid flag word %d");
                            }
                            uStack_143 = (undefined1)local_130.Number;
                            FScanner::MustGetStringName(&local_130,",");
                            FScanner::MustGetString(&local_130);
                            strncpy((char *)&local_158,local_130.String,0x13);
                            uStack_145 = 0;
                            TArray<BitName,_BitName>::Grow(&BitNames,1);
                            pBVar5 = BitNames.Array;
                            *(ulong *)(BitNames.Array[BitNames.Count].Name + 0xe) =
                                 CONCAT17(uStack_143,
                                          CONCAT16(uStack_144,
                                                   CONCAT15(uStack_145,
                                                            CONCAT23(uStack_147,
                                                                     CONCAT12(uStack_148,uStack_14a)
                                                                    ))));
                            *(ulong *)pBVar5[BitNames.Count].Name =
                                 CONCAT44(local_158.Chars._4_4_,(int)local_158.Chars);
                            *(ulong *)(pBVar5[BitNames.Count].Name + 8) =
                                 CONCAT26(uStack_14a,
                                          CONCAT15(uStack_14b,CONCAT14(uStack_14c,uStack_150)));
                            BitNames.Count = BitNames.Count + 1;
                            bVar8 = FScanner::CheckString(&local_130,"}");
                            if ((bVar8) || (FScanner::MustGetStringName(&local_130,","), bVar8))
                            break;
                          }
                        }
                        else {
                          bVar8 = FScanner::Compare(&local_130,"RenderStyles");
                          if (bVar8) {
                            FScanner::MustGetStringName(&local_130,"{");
                            while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                              FScanner::MustGetNumber(&local_130);
                              uStack_144 = (undefined1)local_130.Number;
                              FScanner::MustGetStringName(&local_130,",");
                              FScanner::MustGetString(&local_130);
                              strncpy((char *)&local_158,local_130.String,0x13);
                              uStack_145 = 0;
                              TArray<StyleName,_StyleName>::Grow(&StyleNames,1);
                              pSVar6 = StyleNames.Array;
                              *(ulong *)(StyleNames.Array[StyleNames.Count].Name + 0xd) =
                                   CONCAT17(uStack_144,
                                            CONCAT16(uStack_145,
                                                     CONCAT24(uStack_147,
                                                              CONCAT13(uStack_148,
                                                                       CONCAT21(uStack_14a,
                                                                                uStack_14b)))));
                              *(ulong *)pSVar6[StyleNames.Count].Name =
                                   CONCAT44(local_158.Chars._4_4_,(int)local_158.Chars);
                              *(ulong *)(pSVar6[StyleNames.Count].Name + 8) =
                                   CONCAT26(uStack_14a,
                                            CONCAT15(uStack_14b,CONCAT14(uStack_14c,uStack_150)));
                              StyleNames.Count = StyleNames.Count + 1;
                              bVar8 = FScanner::CheckString(&local_130,"}");
                              if ((bVar8) || (FScanner::MustGetStringName(&local_130,","), bVar8))
                              break;
                            }
                          }
                          else {
                            bVar8 = FScanner::Compare(&local_130,"AmmoNames");
                            if (bVar8) {
                              FScanner::MustGetStringName(&local_130,"{");
                              while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                FScanner::MustGetString(&local_130);
                                bVar8 = FScanner::Compare(&local_130,"NULL");
                                if (bVar8) {
                                  TArray<PClassAmmo_*,_PClassAmmo_*>::Grow(&AmmoNames,1);
                                  pPVar20 = (PClassAmmo *)0x0;
                                }
                                else {
                                  local_158.Chars._0_4_ =
                                       FName::NameManager::FindName
                                                 (&FName::NameData,local_130.String,true);
                                  pPVar19 = PClass::FindClass((FName *)&local_158);
                                  pPVar20 = dyn_cast<PClassAmmo>((DObject *)pPVar19);
                                  if (pPVar20 == (PClassAmmo *)0x0) {
                                    FScanner::ScriptError
                                              (&local_130,"Unknown ammo type \'%s\'",
                                               local_130.String);
                                  }
                                  TArray<PClassAmmo_*,_PClassAmmo_*>::Grow(&AmmoNames,1);
                                }
                                AmmoNames.Array[AmmoNames.Count] = pPVar20;
                                AmmoNames.Count = AmmoNames.Count + 1;
                                bVar8 = FScanner::CheckString(&local_130,"}");
                                if (bVar8) break;
                                FScanner::MustGetStringName(&local_130,",");
                              }
                            }
                            else {
                              bVar8 = FScanner::Compare(&local_130,"WeaponNames");
                              if (bVar8) {
                                if (WeaponNames.Count != 0) {
                                  WeaponNames.Count = 0;
                                }
                                FScanner::MustGetStringName(&local_130,"{");
                                while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                  FScanner::MustGetString(&local_130);
                                  local_158.Chars._0_4_ =
                                       FName::NameManager::FindName
                                                 (&FName::NameData,local_130.String,true);
                                  pPVar16 = (PClassActor *)PClass::FindClass((FName *)&local_158);
                                  if (pPVar16 == (PClassActor *)0x0) {
LAB_00483b0a:
                                    FScanner::ScriptError
                                              (&local_130,"Unknown weapon type \'%s\'",
                                               local_130.String);
                                  }
                                  else {
                                    pPVar23 = pPVar16;
                                    if (pPVar16 != (PClassActor *)AWeapon::RegistrationInfo.MyClass)
                                    {
                                      do {
                                        pPVar23 = (PClassActor *)(pPVar23->super_PClass).ParentClass
                                        ;
                                        if (pPVar23 ==
                                            (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
                                      } while (pPVar23 != (PClassActor *)0x0);
                                      if (pPVar23 == (PClassActor *)0x0) goto LAB_00483b0a;
                                    }
                                  }
                                  TArray<PClassActor_*,_PClassActor_*>::Grow(&WeaponNames,1);
                                  WeaponNames.Array[WeaponNames.Count] = pPVar16;
                                  WeaponNames.Count = WeaponNames.Count + 1;
                                  bVar8 = FScanner::CheckString(&local_130,"}");
                                  if ((bVar8) ||
                                     (FScanner::MustGetStringName(&local_130,","), bVar8)) break;
                                }
                              }
                              else {
                                bVar8 = FScanner::Compare(&local_130,"Aliases");
                                if (bVar8) {
                                  FScanner::MustGetStringName(&local_130,"{");
                                  while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                    local_158.Chars._0_4_ = 0;
                                    FScanner::MustGetString(&local_130);
                                    strncpy((char *)((long)&local_158.Chars + 4),local_130.String,
                                            0x13);
                                    uStack_141 = 0;
                                    FScanner::MustGetStringName(&local_130,",");
                                    FScanner::MustGetString(&local_130);
                                    local_158.Chars._0_4_ =
                                         FName::NameManager::FindName
                                                   (&FName::NameData,local_130.String,false);
                                    FScanner::MustGetStringName(&local_130,",");
                                    FScanner::MustGetNumber(&local_130);
                                    uStack_140 = (undefined1)local_130.Number;
                                    TArray<CodePointerAlias,_CodePointerAlias>::Grow
                                              (&MBFCodePointers,1);
                                    pCVar7 = MBFCodePointers.Array;
                                    uVar22 = (ulong)MBFCodePointers.Count;
                                    MBFCodePointers.Array[uVar22].name.Index = (int)local_158.Chars;
                                    pcVar26 = pCVar7[uVar22].alias;
                                    *(ulong *)pcVar26 = CONCAT44(uStack_150,local_158.Chars._4_4_);
                                    *(ulong *)(pcVar26 + 8) =
                                         CONCAT17(uStack_145,
                                                  CONCAT25(uStack_147,
                                                           CONCAT14(uStack_148,
                                                                    CONCAT22(uStack_14a,
                                                                             CONCAT11(uStack_14b,
                                                                                      uStack_14c))))
                                                 );
                                    *(ulong *)(pCVar7[uVar22].alias + 0xd) =
                                         CONCAT17(uStack_140,
                                                  CONCAT16(uStack_141,
                                                           CONCAT15(uStack_142,
                                                                    CONCAT14(uStack_143,
                                                                             CONCAT13(uStack_144,
                                                                                      CONCAT12(
                                                  uStack_145,uStack_147))))));
                                    MBFCodePointers.Count = MBFCodePointers.Count + 1;
                                    bVar8 = FScanner::CheckString(&local_130,"}");
                                    if ((bVar8) ||
                                       (FScanner::MustGetStringName(&local_130,","), bVar8)) break;
                                  }
                                }
                                else {
                                  FScanner::ScriptError
                                            (&local_130,"Unknown section \'%s\'",local_130.String);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          FScanner::MustGetStringName(&local_130,";");
        }
        FScanner::~FScanner(&local_130);
      }
      do {
        pcVar26 = Line1;
        if (iVar9 == 2) {
          iVar9 = atoi(Line2);
          iVar11 = strcasecmp("Thing",pcVar26);
          if (iVar11 == 0) {
            bVar8 = false;
            paVar30 = Modes;
          }
          else {
            lVar13 = 0;
            do {
              lVar21 = lVar13;
              if (lVar21 + 0x10 == 0xf0) goto LAB_00483d8e;
              __s1 = *(char **)((long)&Modes[1].name + lVar21);
              iVar11 = strcasecmp(__s1,pcVar26);
              lVar13 = lVar21 + 0x10;
            } while (iVar11 != 0);
            bVar8 = __s1 == (char *)0x0;
            paVar30 = (anon_struct_16_2_3f885e32 *)(lVar21 + 0x845aa0);
          }
          if (bVar8) {
LAB_00483d8e:
            Printf("Unknown chunk %s encountered. Skipping.\n",pcVar26);
            do {
              iVar9 = GetLine();
            } while (iVar9 == 1);
          }
          else {
            iVar9 = (*paVar30->func)(iVar9);
          }
        }
        else if (iVar9 == 1) {
          iVar9 = 0;
          Printf("Key %s encountered out of context\n",Line1);
        }
        if (iVar9 == 0) {
          UnloadDehSupp();
          if (PatchName != (char *)0x0) {
            operator_delete__(PatchName);
          }
          if (PatchFile != (char *)0x0) {
            operator_delete__(PatchFile);
          }
          if (batchrun != false) {
            return true;
          }
          Printf("Patch installed\n");
          return true;
        }
      } while( true );
    }
    Printf("Warning: DEHSUPP no longer supported. DEHACKED patch disabled.\n");
  }
  Printf("Could not load DEH support data\n");
  UnloadDehSupp();
LAB_00482d6f:
  if (PatchName != (char *)0x0) {
    operator_delete__(PatchName);
  }
  if (PatchFile != (char *)0x0) {
    operator_delete__(PatchFile);
  }
  return false;
}

Assistant:

static bool DoDehPatch()
{
	if (!batchrun) Printf("Adding dehacked patch %s\n", PatchName);

	int cont;

	dversion = pversion = -1;
	cont = 0;
	if (0 == strncmp (PatchFile, "Patch File for DeHackEd v", 25))
	{
		if (PatchFile[25] < '3' && PatchFile[25] != '2' && PatchFile[27] != '3')
		{
			Printf (PRINT_BOLD, "\"%s\" is an old and unsupported DeHackEd patch\n", PatchName);
			delete[] PatchName;
			delete[] PatchFile;
			return false;
		}
		// fix for broken WolfenDoom patches which contain \0 characters in some places.
		for (int i = 0; i < PatchSize; i++)
		{
			if (PatchFile[i] == 0) PatchFile[i] = ' ';	
		}

		PatchPt = strchr (PatchFile, '\n');
		while ((cont = GetLine()) == 1)
		{
				 CHECKKEY ("Doom version", dversion)
			else CHECKKEY ("Patch format", pversion)
		}
		if (!cont || dversion == -1 || pversion == -1)
		{
			delete[] PatchName;
			delete[] PatchFile;
			Printf (PRINT_BOLD, "\"%s\" is not a DeHackEd patch file\n", PatchFile);
			return false;
		}
	}
	else
	{
		DPrintf (DMSG_WARNING, "Patch does not have DeHackEd signature. Assuming .bex\n");
		dversion = 19;
		pversion = 6;
		PatchPt = PatchFile;
		while ((cont = GetLine()) == 1)
		{}
	}

	if (pversion != 5 && pversion != 6)
	{
		Printf ("DeHackEd patch version is %d.\nUnexpected results may occur.\n", pversion);
	}

	if (dversion == 16)
		dversion = 0;
	else if (dversion == 17)
		dversion = 2;
	else if (dversion == 19)
		dversion = 3;
	else if (dversion == 20)
		dversion = 1;
	else if (dversion == 21)
		dversion = 4;
	else
	{
		Printf ("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
		dversion = 3;
	}

	if (!LoadDehSupp ())
	{
		Printf ("Could not load DEH support data\n");
		UnloadDehSupp ();
		delete[] PatchName;
		delete[] PatchFile;
		return false;
	}

	do
	{
		if (cont == 1)
		{
			Printf ("Key %s encountered out of context\n", Line1);
			cont = 0;
		}
		else if (cont == 2)
		{
			cont = HandleMode (Line1, atoi (Line2));
		}
	} while (cont);

	UnloadDehSupp ();
	delete[] PatchName;
	delete[] PatchFile;
	if (!batchrun) Printf ("Patch installed\n");
	return true;
}